

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.h
# Opt level: O2

bool Js::PropertyRecordStringHashComparer<Js::HashedCharacterBuffer<char16_t>_*>::Equals
               (HashedCharacterBuffer<char16_t> *str1,HashedCharacterBuffer<char16_t> *str2)

{
  charcount_t length;
  bool bVar1;
  
  length = (str1->super_CharacterBuffer<char16_t>).len;
  if ((length == (str2->super_CharacterBuffer<char16_t>).len) &&
     (*(int *)&(str1->super_CharacterBuffer<char16_t>).field_0xc ==
      *(int *)&(str2->super_CharacterBuffer<char16_t>).field_0xc)) {
    bVar1 = JsUtil::CharacterBuffer<char16_t>::StaticEquals
                      ((str1->super_CharacterBuffer<char16_t>).string.ptr,
                       (str2->super_CharacterBuffer<char16_t>).string.ptr,length);
    return bVar1;
  }
  return false;
}

Assistant:

inline static bool Equals(HashedCharacterBuffer<char16>* const str1, HashedCharacterBuffer<char16>* const str2)
        {
            return (str1->GetLength() == str2->GetLength() &&
                str1->GetHashCode() == str2->GetHashCode() &&
                JsUtil::CharacterBuffer<char16>::StaticEquals(str1->GetBuffer(), str2->GetBuffer(), str1->GetLength()));
        }